

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.hpp
# Opt level: O0

pair<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_> *
__thiscall
jessilib::
split_once<std::vector<char,std::allocator<char>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,char>
          (pair<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> begin,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> end,
          char in_delim)

{
  bool bVar1;
  reference pcVar2;
  vector<char,_std::allocator<char>_> local_e0;
  char *local_c8;
  char *local_c0;
  vector<char,_std::allocator<char>_> local_b8;
  char *local_90;
  char *local_88;
  vector<char,_std::allocator<char>_> local_80;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_68;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> itr;
  undefined1 local_58 [8];
  pair<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_> result;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> _Stack_20;
  char in_delim_local;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> end_local;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> begin_local;
  
  result.second.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ =
       SUB81(end._M_current,0);
  _Stack_20._M_current = begin._M_current;
  end_local._M_current = (char *)this;
  std::pair<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>::
  pair<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_true>
            ((pair<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>
              *)local_58);
  itr._M_current._7_1_ =
       __gnu_cxx::operator<=><char_const*,std::vector<char,std::allocator<char>>>
                 (&end_local,&stack0xffffffffffffffe0);
  std::__cmp_cat::__unspec::__unspec((__unspec *)((long)&itr._M_current + 6),(__unspec *)0x0);
  bVar1 = std::operator>=(itr._M_current._7_1_);
  if (bVar1) {
    std::pair<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>::
    pair(__return_storage_ptr__,
         (pair<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>
          *)local_58);
  }
  else {
    local_68._M_current = end_local._M_current;
    while( true ) {
      bVar1 = __gnu_cxx::operator==<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                        (&local_68,&stack0xffffffffffffffe0);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      pcVar2 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
               ::operator*(&local_68);
      if (*pcVar2 == result.second.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_) {
        local_88 = end_local._M_current;
        local_90 = local_68._M_current;
        make_split_member<std::vector<char,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_nullptr>
                  (&local_80,end_local,local_68);
        std::vector<char,_std::allocator<char>_>::operator=
                  ((vector<char,_std::allocator<char>_> *)local_58,&local_80);
        std::vector<char,_std::allocator<char>_>::~vector(&local_80);
        local_c0 = (char *)__gnu_cxx::
                           __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                           ::operator+(&local_68,1);
        local_c8 = _Stack_20._M_current;
        make_split_member<std::vector<char,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_nullptr>
                  (&local_b8,
                   (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                   local_c0,_Stack_20);
        std::vector<char,_std::allocator<char>_>::operator=
                  ((vector<char,_std::allocator<char>_> *)
                   &result.first.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                   &local_b8);
        std::vector<char,_std::allocator<char>_>::~vector(&local_b8);
        std::
        pair<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>::
        pair(__return_storage_ptr__,
             (pair<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>
              *)local_58);
        goto LAB_004d0fec;
      }
      __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
      operator++(&local_68);
    }
    make_split_member<std::vector<char,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_nullptr>
              (&local_e0,end_local,_Stack_20);
    std::vector<char,_std::allocator<char>_>::operator=
              ((vector<char,_std::allocator<char>_> *)local_58,&local_e0);
    std::vector<char,_std::allocator<char>_>::~vector(&local_e0);
    std::pair<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>::
    pair(__return_storage_ptr__,
         (pair<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>
          *)local_58);
  }
LAB_004d0fec:
  itr._M_current._0_4_ = 1;
  std::pair<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>::
  ~pair((pair<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_> *
        )local_58);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto split_once(ItrT begin, EndT end, ElementT in_delim) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to split
		return result;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_delim) {
			// in_delim found; split upon it
			result.first = make_split_member<MemberT>(begin, itr);
			result.second = make_split_member<MemberT>(itr + 1, end);
			return result;
		}
	}

	// in_delim not found
	result.first = make_split_member<MemberT>(begin, end);
	return result;
}